

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O1

void assertEquals<int,unsigned_long>(int t1,unsigned_long t2)

{
  runtime_error *this;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if ((long)t1 == t2) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Assertion failed: ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Expected:",9);
  std::ostream::operator<<(local_190,t1);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,", Got:",6);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void assertEquals(T1 t1, T2 t2)
{
	if(!(t1 == t2))
	{
		std::stringstream ss;
		ss << "Assertion failed: ";
		ss << "Expected:" << t1;
		ss << ", Got:" << t2;
		throw std::runtime_error(ss.str());
	}
}